

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O3

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::clear(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
        *this)

{
  pointer ppvVar1;
  int iVar2;
  pointer pvVar3;
  void **ptr;
  pointer ppvVar4;
  long lVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    pvVar3 = (this->free_data).
             super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      ppvVar4 = *(pointer *)
                 &pvVar3[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl;
      ppvVar1 = *(pointer *)
                 ((long)&pvVar3[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl +
                 8);
      if (ppvVar4 != ppvVar1) {
        do {
          free(*ppvVar4);
          ppvVar4 = ppvVar4 + 1;
        } while (ppvVar4 != ppvVar1);
        pvVar3 = (this->free_data).
                 super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppvVar4 = *(pointer *)
                   &pvVar3[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl;
        if (*(pointer *)
             ((long)&pvVar3[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8)
            != ppvVar4) {
          *(pointer *)
           ((long)&pvVar3[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8) =
               ppvVar4;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x3d);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void clear() {
    std::lock_guard<std::mutex> lg(mutex);
    for (size_t bin = 0; bin < bin_sizes.size(); ++bin) {
      for (auto&& ptr : free_data[bin]) {
        allocator.deallocate(ptr);
      }
      free_data[bin].clear();
    }
  }